

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O2

ssize_t __thiscall libnbt::NBTTagList::read(NBTTagList *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 extraout_var;
  ssize_t extraout_RAX;
  int i;
  undefined4 in_register_00000034;
  istream *in;
  int32_t size;
  NBTBase *tag;
  ssize_t sVar2;
  
  in = (istream *)CONCAT44(in_register_00000034,__fd);
  std::istream::get((char *)in);
  size = 0;
  readBytes(in,(char *)&size,'\x04');
  iVar1 = (*(this->super_NBTTagVector<libnbt::NBTBase_*>).super_NBTBase._vptr_NBTBase[8])(this);
  sVar2 = CONCAT44(extraout_var,iVar1);
  for (iVar1 = 0; iVar1 < size; iVar1 = iVar1 + 1) {
    tag = createNewTag(this->child);
    (**tag->_vptr_NBTBase)(tag,in);
    std::vector<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>::push_back
              (&(this->super_NBTTagVector<libnbt::NBTBase_*>).array,&tag);
    sVar2 = extraout_RAX;
  }
  return sVar2;
}

Assistant:

void NBTTagList::read(std::istream &in) {
        in.get(child);
        int32_t size = 0;
        readBytes(in, (char *) &size, 4);
        clear();
        for (int i = 0; i < size; i++) {
            auto *tag = createNewTag((TAG_TYPE) child);
            tag->read(in);
            array.push_back(tag);
        }
    }